

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O0

string * __thiscall
VideoHppGenerator::generateStructMembers
          (string *__return_storage_ptr__,VideoHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
          *structData)

{
  bool bVar1;
  reference this_00;
  pointer ppVar2;
  const_reference pvVar3;
  byte local_332;
  bool local_331;
  bool local_321;
  bool local_301;
  bool local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  string valueName;
  undefined1 local_208 [8];
  string prefix;
  _Self local_1e0;
  const_iterator enumIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string type;
  MemberData *member;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_> *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
  *structData_local;
  VideoHppGenerator *this_local;
  string *members;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>::
           begin(&(structData->second).members);
  member = (MemberData *)
           std::
           vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>::
           end(&(structData->second).members);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VideoHppGenerator::MemberData_*,_std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>_>
                      (&__end1,(__normal_iterator<const_VideoHppGenerator::MemberData_*,_std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>_>
                                *)&member);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return __return_storage_ptr__;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_VideoHppGenerator::MemberData_*,_std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>_>
              ::operator*(&__end1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,"    ");
    std::__cxx11::string::string((string *)local_78);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this_00->bitCount);
    if ((bVar1) ||
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(&(this_00->type).type,"StdVideo"), !bVar1)) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->arraySizes);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE",&local_b9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"StdVideo",&local_e1)
        ;
        TypeInfo::compose(&local_98,&this_00->type,&local_b8,&local_e0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
      else {
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        local_301 = false;
        if (bVar1) {
          local_301 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&(this_00->type).postfix);
        }
        if (local_301 == false) {
          __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                        ,0x163,
                        "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                       );
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE",
                   &local_149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Vk",&local_171);
        TypeInfo::compose(&local_128,&this_00->type,&local_148,&local_170);
        generateStandardArrayWrapper(&local_108,&local_128,&this_00->arraySizes);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
      }
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
      local_2e1 = false;
      if (bVar1) {
        local_2e1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty(&(this_00->type).postfix);
      }
      if (local_2e1 == false) {
        __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0x15a,
                      "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                     );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &(this_00->type).type);
    }
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78," "
                  );
    std::operator+(&local_198,&local_1b8,&this_00->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this_00->arraySizes);
    local_321 = true;
    if (!bVar1) {
      local_321 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty(&this_00->bitCount);
    }
    if (local_321 == false) break;
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this_00->bitCount);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__," = ");
      local_1e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
           ::find(&this->m_enums,&(this_00->type).type);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->arraySizes);
      local_331 = false;
      if (bVar1) {
        prefix.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
             ::end(&this->m_enums);
        bVar1 = std::operator==(&local_1e0,(_Self *)((long)&prefix.field_2 + 8));
        local_331 = false;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_331 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (&(this_00->type).postfix);
        }
      }
      if (local_331 == false) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,"{}");
      }
      else {
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        local_332 = 0;
        if (bVar1) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this_00->arraySizes);
          local_332 = 0;
          if (bVar1) {
            ppVar2 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>
                     ::operator->(&local_1e0);
            bVar1 = std::
                    vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
                    ::empty(&(ppVar2->second).values);
            local_332 = bVar1 ^ 0xff;
          }
        }
        if ((local_332 & 1) == 0) {
          __assert_fail("member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                        ,0x175,
                        "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                       );
        }
        toUpperCase((string *)((long)&valueName.field_2 + 8),&(this_00->type).type);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&valueName.field_2 + 8),"_");
        std::__cxx11::string::~string((string *)(valueName.field_2._M_local_buf + 8));
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>
                 ::operator->(&local_1e0);
        pvVar3 = std::
                 vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
                 ::front(&(ppVar2->second).values);
        stripPrefix(&local_288,&pvVar3->name,(string *)local_208);
        toCamelCase(&local_268,&local_288,true);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,"e",&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::operator+(&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"::");
        std::operator+(&local_2a8,&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)local_208);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enumIt,
                     " : ",&this_00->bitCount);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enumIt);
      std::__cxx11::string::~string((string *)&enumIt);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,";\n");
    std::__cxx11::string::~string((string *)local_78);
    __gnu_cxx::
    __normal_iterator<const_VideoHppGenerator::MemberData_*,_std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("member.arraySizes.empty() || member.bitCount.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                ,0x169,
                "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
               );
}

Assistant:

std::string VideoHppGenerator::generateStructMembers( std::pair<std::string, StructureData> const & structData ) const
{
  std::string members;
  for ( auto const & member : structData.second.members )
  {
    members += "    ";
    std::string type;
    if ( !member.bitCount.empty() && member.type.type.starts_with( "StdVideo" ) )
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );  // never encounterd a different case
      type = member.type.type;
    }
    else if ( member.arraySizes.empty() )
    {
      type = member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE", "StdVideo" );
    }
    else
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );
      type = generateStandardArrayWrapper( member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE" ), member.arraySizes );
    }
    members += type + " " + member.name;

    // as we don't have any meaningful default initialization values, everything can be initialized by just '{}' !
    assert( member.arraySizes.empty() || member.bitCount.empty() );
    if ( !member.bitCount.empty() )
    {
      members += " : " + member.bitCount;  // except for bitfield members, where no default member initialization
                                           // is supported (up to C++20)
    }
    else
    {
      members += " = ";
      auto enumIt = m_enums.find( member.type.type );
      if ( member.arraySizes.empty() && ( enumIt != m_enums.end() ) && member.type.postfix.empty() )
      {
        assert( member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty() );

        std::string prefix    = toUpperCase( member.type.type ) + "_";
        std::string valueName = "e" + toCamelCase( stripPrefix( enumIt->second.values.front().name, prefix ), true );

        members += type + "::" + valueName;
      }
      else
      {
        members += "{}";
      }
    }
    members += ";\n";
  }
  return members;
}